

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling.h
# Opt level: O3

optional<pbrt::Point2<float>_> __thiscall
pbrt::PiecewiseConstant2D::Invert(PiecewiseConstant2D *this,Point2f *p)

{
  undefined1 auVar1 [16];
  undefined4 extraout_EDX;
  undefined4 extraout_EDX_00;
  undefined4 uVar2;
  Float *in_RDX;
  float fVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 in_XMM3 [16];
  optional<pbrt::Point2<float>_> oVar6;
  optional<float> mInv;
  float local_30;
  char local_2c;
  float local_28;
  char local_24;
  
  PiecewiseConstant1D::Invert((PiecewiseConstant1D *)&local_30,in_RDX[1]);
  uVar2 = extraout_EDX;
  if (((local_2c != '\0') &&
      (fVar3 = (p->super_Tuple2<pbrt::Point2,_float>).y,
      fVar3 = (in_RDX[1] - fVar3) / (p[1].super_Tuple2<pbrt::Point2,_float>.y - fVar3), 0.0 <= fVar3
      )) && (fVar3 <= 1.0)) {
    auVar5._0_12_ = ZEXT812(0);
    auVar5._12_4_ = 0;
    auVar4 = vcvtusi2ss_avx512f(in_XMM3,p[5].super_Tuple2<pbrt::Point2,_float>);
    auVar1 = vcvtusi2ss_avx512f(in_XMM3,(long)p[5].super_Tuple2<pbrt::Point2,_float> + -1);
    auVar4 = ZEXT416((uint)(fVar3 * auVar4._0_4_));
    vcmpss_avx512f(auVar4,auVar5,1);
    vminss_avx(auVar1,auVar4);
    PiecewiseConstant1D::Invert((PiecewiseConstant1D *)&local_28,*in_RDX);
    uVar2 = extraout_EDX_00;
    if (local_24 == '\x01') {
      if (local_2c == '\0') {
        LogFatal<char_const(&)[4]>
                  (Fatal,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/pstd.h"
                   ,0xea,"Check failed: %s",(char (*) [4])0x56907c);
      }
      *(undefined1 *)&(this->domain).pMax.super_Tuple2<pbrt::Point2,_float>.x = 1;
      (this->domain).pMin.super_Tuple2<pbrt::Point2,_float>.x = local_28;
      (this->domain).pMin.super_Tuple2<pbrt::Point2,_float>.y = local_30;
      goto LAB_002ee2f9;
    }
  }
  (this->domain).pMax.super_Tuple2<pbrt::Point2,_float>.x = 0.0;
  (this->domain).pMin.super_Tuple2<pbrt::Point2,_float> = (Tuple2<pbrt::Point2,_float>)0x0;
LAB_002ee2f9:
  oVar6._8_4_ = uVar2;
  oVar6.optionalValue =
       (aligned_storage_t<sizeof(pbrt::Point2<float>),_alignof(pbrt::Point2<float>)>)this;
  return oVar6;
}

Assistant:

PBRT_CPU_GPU
    pstd::optional<Point2f> Invert(const Point2f &p) const {
        pstd::optional<Float> mInv = pMarginal.Invert(p[1]);
        if (!mInv)
            return {};
        Float p1o = (p[1] - domain.pMin[1]) / (domain.pMax[1] - domain.pMin[1]);
        if (p1o < 0 || p1o > 1)
            return {};
        int offset = Clamp(p1o * pConditionalV.size(), 0, pConditionalV.size() - 1);
        pstd::optional<Float> cInv = pConditionalV[offset].Invert(p[0]);
        if (!cInv)
            return {};
        return Point2f(*cInv, *mInv);
    }